

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorUtil.c
# Opt level: O2

int WriteResultIntoFile(char *pFileName)

{
  FILE *__s;
  tm *__tp;
  char *pcVar1;
  time_t ltime;
  
  __s = fopen(pFileName,"w");
  if (__s == (FILE *)0x0) {
    fwrite("\n\nCannot open the output file\n",0x1e,1,(FILE *)0x0);
  }
  else {
    time(&ltime);
    __tp = localtime(&ltime);
    pcVar1 = asctime(__tp);
    g_CoverInfo.nLiteralsAfter = CountLiteralsCheck();
    g_CoverInfo.QCostAfter = CountQCost();
    fwrite("# EXORCISM-4 output for command line arguments: ",0x30,1,__s);
    fprintf(__s,"\"-Q %d -V %d\"\n",(ulong)(uint)g_CoverInfo.Quality,
            (ulong)(uint)g_CoverInfo.Verbosity);
    fprintf(__s,"# Minimization performed %s",pcVar1);
    fwrite("# Initial statistics: ",0x16,1,__s);
    fprintf(__s,"Cubes = %d  Literals = %d  QCost = %d\n",(ulong)(uint)g_CoverInfo.nCubesBefore,
            (ulong)(uint)g_CoverInfo.nLiteralsBefore,(ulong)(uint)g_CoverInfo.QCostBefore);
    fwrite("# Final   statistics: ",0x16,1,__s);
    fprintf(__s,"Cubes = %d  Literals = %d  QCost = %d\n",(ulong)(uint)g_CoverInfo.nCubesInUse,
            (ulong)(uint)g_CoverInfo.nLiteralsAfter,(ulong)(uint)g_CoverInfo.QCostAfter);
    fprintf(__s,"# File reading and reordering time = %.2f sec\n",
            (double)((float)g_CoverInfo.TimeRead / 1e+06));
    fprintf(__s,"# Starting cover generation time   = %.2f sec\n",
            (double)((float)g_CoverInfo.TimeStart / 1e+06));
    fprintf(__s,"# Pure ESOP minimization time      = %.2f sec\n",
            (double)((float)g_CoverInfo.TimeMin / 1e+06));
    fprintf(__s,".i %d\n",(ulong)(uint)g_CoverInfo.nVarsIn);
    fprintf(__s,".o %d\n",(ulong)(uint)g_CoverInfo.nVarsOut);
    fprintf(__s,".p %d\n",(ulong)(uint)g_CoverInfo.nCubesInUse);
    fwrite(".type esop\n",0xb,1,__s);
    WriteTableIntoFile((FILE *)__s);
    fwrite(".e\n",3,1,__s);
    fclose(__s);
  }
  return (uint)(__s == (FILE *)0x0);
}

Assistant:

int WriteResultIntoFile( char * pFileName )
// write the ESOP cover into the PLA file <NewFileName>
{
    FILE * pFile;
    time_t ltime;
    char * TimeStr;

    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( pFile, "\n\nCannot open the output file\n" );
        return 1;
    }

    // get current time
    time( &ltime );
    TimeStr = asctime( localtime( &ltime ) );
    // get the number of literals
    g_CoverInfo.nLiteralsAfter = CountLiteralsCheck();
    g_CoverInfo.QCostAfter = CountQCost();
    fprintf( pFile, "# EXORCISM-4 output for command line arguments: " );
    fprintf( pFile, "\"-Q %d -V %d\"\n", g_CoverInfo.Quality, g_CoverInfo.Verbosity );
    fprintf( pFile, "# Minimization performed %s", TimeStr );
    fprintf( pFile, "# Initial statistics: " );
    fprintf( pFile, "Cubes = %d  Literals = %d  QCost = %d\n", g_CoverInfo.nCubesBefore, g_CoverInfo.nLiteralsBefore, g_CoverInfo.QCostBefore );
    fprintf( pFile, "# Final   statistics: " );
    fprintf( pFile, "Cubes = %d  Literals = %d  QCost = %d\n", g_CoverInfo.nCubesInUse, g_CoverInfo.nLiteralsAfter, g_CoverInfo.QCostAfter );
    fprintf( pFile, "# File reading and reordering time = %.2f sec\n", TICKS_TO_SECONDS(g_CoverInfo.TimeRead) );
    fprintf( pFile, "# Starting cover generation time   = %.2f sec\n", TICKS_TO_SECONDS(g_CoverInfo.TimeStart) );
    fprintf( pFile, "# Pure ESOP minimization time      = %.2f sec\n", TICKS_TO_SECONDS(g_CoverInfo.TimeMin) );
    fprintf( pFile, ".i %d\n", g_CoverInfo.nVarsIn );
    fprintf( pFile, ".o %d\n", g_CoverInfo.nVarsOut );
    fprintf( pFile, ".p %d\n", g_CoverInfo.nCubesInUse );
    fprintf( pFile, ".type esop\n" );
    WriteTableIntoFile( pFile );
    fprintf( pFile, ".e\n" );
    fclose( pFile );
    return 0;
}